

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

uint32_t predict_sublearner_adf(warm_cb *data,multi_learner *base,example *ec,uint32_t i)

{
  uint64_t *puVar1;
  int iVar2;
  pointer ppeVar3;
  pointer ppeVar4;
  multi_ex *__range1;
  
  copy_example_to_adf(data,ec);
  ppeVar4 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar4 != ppeVar3) {
    iVar2 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar4)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(iVar2 * i);
      ppeVar4 = ppeVar4 + 1;
    } while (ppeVar4 != ppeVar3);
  }
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&data->ecs);
  ppeVar4 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar4 != ppeVar3) {
    iVar2 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar4)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(i * iVar2);
      ppeVar4 = ppeVar4 + 1;
    } while (ppeVar4 != ppeVar3);
  }
  return (((*(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_start)->pred).a_s._begin)->action + 1;
}

Assistant:

uint32_t predict_sublearner_adf(warm_cb& data, multi_learner& base, example& ec, uint32_t i)
{
	copy_example_to_adf(data, ec);
	base.predict(data.ecs, i);
	return data.ecs[0]->pred.a_s[0].action+1;
}